

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall
CTcPrsNode::gen_code_member
          (CTcPrsNode *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  int varargs_00;
  
  (**(this->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(this,0,0);
  varargs_00 = 0;
  if (varargs != 0) {
    CTcGenTarg::write_op(G_cg,0x8d);
    varargs_00 = varargs;
  }
  s_gen_member_rhs(discard,prop_expr,prop_is_expr,argc,varargs_00,named_args);
  return;
}

Assistant:

void CTcPrsNode::gen_code_member(int discard,
                                 CTcPrsNode *prop_expr, int prop_is_expr,
                                 int argc, int varargs,
                                 CTcNamedArgs *named_args)
{
    /* evaluate my own expression to yield the object value */
    gen_code(FALSE, FALSE);

    /* if we have an argument counter, put it back on top */
    if (varargs)
        G_cg->write_op(OPC_SWAP);

    /* use the generic code to generate the rest */
    s_gen_member_rhs(discard, prop_expr, prop_is_expr,
                     argc, varargs, named_args);
}